

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O3

void RGB565ToARGBRow_SSE2(uint8_t *src,uint8_t *dst,int width)

{
  uint8_t *puVar1;
  bool bVar2;
  int iVar3;
  undefined1 (*pauVar4) [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar18._8_4_ = 0x1080108;
  auVar18._0_8_ = 0x108010801080108;
  auVar18._12_4_ = 0x1080108;
  auVar19._8_4_ = 0x20802080;
  auVar19._0_8_ = 0x2080208020802080;
  auVar19._12_4_ = 0x20802080;
  auVar15[8] = 0xff;
  auVar15._0_8_ = 0xffffffffffffffff;
  auVar15[9] = 0xff;
  auVar15[10] = 0xff;
  auVar15[0xb] = 0xff;
  auVar15[0xc] = 0xff;
  auVar15[0xd] = 0xff;
  auVar15[0xe] = 0xff;
  auVar15[0xf] = 0xff;
  auVar15 = psllw(auVar15,0xb);
  auVar16[8] = 0xff;
  auVar16._0_8_ = 0xffffffffffffffff;
  auVar16[9] = 0xff;
  auVar16[10] = 0xff;
  auVar16[0xb] = 0xff;
  auVar16[0xc] = 0xff;
  auVar16[0xd] = 0xff;
  auVar16[0xe] = 0xff;
  auVar16[0xf] = 0xff;
  auVar16 = psllw(auVar16,10);
  auVar17._0_2_ = auVar16._0_2_ >> 5;
  auVar17._2_2_ = auVar16._2_2_ >> 5;
  auVar17._4_2_ = auVar16._4_2_ >> 5;
  auVar17._6_2_ = auVar16._6_2_ >> 5;
  auVar17._8_2_ = auVar16._8_2_ >> 5;
  auVar17._10_2_ = auVar16._10_2_ >> 5;
  auVar17._12_2_ = auVar16._12_2_ >> 5;
  auVar17._14_2_ = auVar16._14_2_ >> 5;
  auVar5[8] = 0xff;
  auVar5._0_8_ = 0xffffffffffffffff;
  auVar5[9] = 0xff;
  auVar5[10] = 0xff;
  auVar5[0xb] = 0xff;
  auVar5[0xc] = 0xff;
  auVar5[0xd] = 0xff;
  auVar5[0xe] = 0xff;
  auVar5[0xf] = 0xff;
  auVar16 = psllw(auVar5,8);
  pauVar4 = (undefined1 (*) [16])src;
  do {
    auVar5 = *pauVar4;
    auVar14 = psllw(auVar5,0xb);
    auVar6 = pmulhuw(auVar5 & auVar15,auVar18);
    auVar14 = pmulhuw(auVar14,auVar18);
    auVar6 = psllw(auVar6,8);
    auVar6 = auVar6 | auVar14;
    auVar5 = pmulhuw(auVar5 & auVar17,auVar19);
    auVar5 = auVar5 | auVar16;
    auVar14._0_14_ = auVar6._0_14_;
    auVar14[0xe] = auVar6[7];
    auVar14[0xf] = auVar5[7];
    auVar13._14_2_ = auVar14._14_2_;
    auVar13._0_13_ = auVar6._0_13_;
    auVar13[0xd] = auVar5[6];
    auVar12._13_3_ = auVar13._13_3_;
    auVar12._0_12_ = auVar6._0_12_;
    auVar12[0xc] = auVar6[6];
    auVar11._12_4_ = auVar12._12_4_;
    auVar11._0_11_ = auVar6._0_11_;
    auVar11[0xb] = auVar5[5];
    auVar10._11_5_ = auVar11._11_5_;
    auVar10._0_10_ = auVar6._0_10_;
    auVar10[10] = auVar6[5];
    auVar9._10_6_ = auVar10._10_6_;
    auVar9._0_9_ = auVar6._0_9_;
    auVar9[9] = auVar5[4];
    auVar8._9_7_ = auVar9._9_7_;
    auVar8._0_8_ = auVar6._0_8_;
    auVar8[8] = auVar6[4];
    auVar7._8_8_ = auVar8._8_8_;
    auVar7[7] = auVar5[3];
    auVar7[6] = auVar6[3];
    auVar7[5] = auVar5[2];
    auVar7[4] = auVar6[2];
    auVar7[3] = auVar5[1];
    auVar7[2] = auVar6[1];
    auVar7[0] = auVar6[0];
    auVar7[1] = auVar5[0];
    *(undefined1 (*) [16])(dst + (long)pauVar4 * 2 + (long)src * -2) = auVar7;
    puVar1 = dst + (long)pauVar4 * 2 + (long)src * -2 + 0x10;
    *puVar1 = auVar6[8];
    puVar1[1] = auVar5[8];
    puVar1[2] = auVar6[9];
    puVar1[3] = auVar5[9];
    puVar1[4] = auVar6[10];
    puVar1[5] = auVar5[10];
    puVar1[6] = auVar6[0xb];
    puVar1[7] = auVar5[0xb];
    puVar1[8] = auVar6[0xc];
    puVar1[9] = auVar5[0xc];
    puVar1[10] = auVar6[0xd];
    puVar1[0xb] = auVar5[0xd];
    puVar1[0xc] = auVar6[0xe];
    puVar1[0xd] = auVar5[0xe];
    puVar1[0xe] = auVar6[0xf];
    puVar1[0xf] = auVar5[0xf];
    pauVar4 = pauVar4 + 1;
    iVar3 = width + -8;
    bVar2 = 7 < width;
    width = iVar3;
  } while (iVar3 != 0 && bVar2);
  return;
}

Assistant:

void RGB565ToARGBRow_SSE2(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "mov         $0x1080108,%%eax              \n"
      "movd        %%eax,%%xmm5                  \n"
      "pshufd      $0x0,%%xmm5,%%xmm5            \n"
      "mov         $0x20802080,%%eax             \n"
      "movd        %%eax,%%xmm6                  \n"
      "pshufd      $0x0,%%xmm6,%%xmm6            \n"
      "pcmpeqb     %%xmm3,%%xmm3                 \n"
      "psllw       $0xb,%%xmm3                   \n"
      "pcmpeqb     %%xmm4,%%xmm4                 \n"
      "psllw       $0xa,%%xmm4                   \n"
      "psrlw       $0x5,%%xmm4                   \n"
      "pcmpeqb     %%xmm7,%%xmm7                 \n"
      "psllw       $0x8,%%xmm7                   \n"
      "sub         %0,%1                         \n"
      "sub         %0,%1                         \n"

      LABELALIGN
      "1:                                        \n"
      "movdqu      (%0),%%xmm0                   \n"
      "movdqa      %%xmm0,%%xmm1                 \n"
      "movdqa      %%xmm0,%%xmm2                 \n"
      "pand        %%xmm3,%%xmm1                 \n"
      "psllw       $0xb,%%xmm2                   \n"
      "pmulhuw     %%xmm5,%%xmm1                 \n"
      "pmulhuw     %%xmm5,%%xmm2                 \n"
      "psllw       $0x8,%%xmm1                   \n"
      "por         %%xmm2,%%xmm1                 \n"
      "pand        %%xmm4,%%xmm0                 \n"
      "pmulhuw     %%xmm6,%%xmm0                 \n"
      "por         %%xmm7,%%xmm0                 \n"
      "movdqa      %%xmm1,%%xmm2                 \n"
      "punpcklbw   %%xmm0,%%xmm1                 \n"
      "punpckhbw   %%xmm0,%%xmm2                 \n"
      "movdqu      %%xmm1,0x00(%1,%0,2)          \n"
      "movdqu      %%xmm2,0x10(%1,%0,2)          \n"
      "lea         0x10(%0),%0                   \n"
      "sub         $0x8,%2                       \n"
      "jg          1b                            \n"
      : "+r"(src),   // %0
        "+r"(dst),   // %1
        "+r"(width)  // %2
      :
      : "memory", "cc", "eax", "xmm0", "xmm1", "xmm2", "xmm3", "xmm4", "xmm5",
        "xmm6", "xmm7");
}